

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O3

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_alg(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_pk_type_t mVar1;
  byte bVar2;
  
  bVar2 = info->key_exchange - 2;
  mVar1 = MBEDTLS_PK_NONE;
  if (bVar2 < 3) {
    mVar1 = (&DAT_0021cb3c)[bVar2];
  }
  return mVar1;
}

Assistant:

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_alg(const mbedtls_ssl_ciphersuite_t *info)
{
    switch (info->key_exchange) {
        case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
            return MBEDTLS_PK_RSA;

        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
            return MBEDTLS_PK_ECDSA;

        default:
            return MBEDTLS_PK_NONE;
    }
}